

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

size_t __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexExpanderShader::calcOutputVertices
          (VertexExpanderShader *this,GeometryShaderInputType inputType)

{
  GeometryShaderInputType inputType_local;
  VertexExpanderShader *this_local;
  
  switch(inputType) {
  case GEOMETRYSHADERINPUTTYPE_POINTS:
    this_local = (VertexExpanderShader *)0x3;
    break;
  case GEOMETRYSHADERINPUTTYPE_LINES:
    this_local = (VertexExpanderShader *)0x6;
    break;
  case GEOMETRYSHADERINPUTTYPE_LINES_ADJACENCY:
    this_local = (VertexExpanderShader *)0xc;
    break;
  case GEOMETRYSHADERINPUTTYPE_TRIANGLES:
    this_local = (VertexExpanderShader *)&DAT_00000009;
    break;
  case GEOMETRYSHADERINPUTTYPE_TRIANGLES_ADJACENCY:
    this_local = (VertexExpanderShader *)0x12;
    break;
  default:
    this_local = (VertexExpanderShader *)0x0;
  }
  return (size_t)this_local;
}

Assistant:

size_t VertexExpanderShader::calcOutputVertices (rr::GeometryShaderInputType inputType) const
{
	switch (inputType)
	{
		case rr::GEOMETRYSHADERINPUTTYPE_POINTS:				return 1 * 3;
		case rr::GEOMETRYSHADERINPUTTYPE_LINES:					return 2 * 3;
		case rr::GEOMETRYSHADERINPUTTYPE_LINES_ADJACENCY:		return 4 * 3;
		case rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES:				return 3 * 3;
		case rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES_ADJACENCY:	return 6 * 3;
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}